

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O2

LY_ERR ly_set_rm(ly_set *set,void *object,_func_void_void_ptr *destructor)

{
  LY_ERR LVar1;
  ulong uVar2;
  char *pcVar3;
  
  if (set == (ly_set *)0x0) {
    pcVar3 = "set";
  }
  else {
    if (object != (void *)0x0) {
      for (uVar2 = 0; set->count != uVar2; uVar2 = uVar2 + 1) {
        if ((set->field_2).dnodes[uVar2] == (lyd_node *)object) {
          if (set->count != (uint32_t)uVar2) {
            LVar1 = ly_set_rm_index(set,(uint32_t)uVar2,destructor);
            return LVar1;
          }
          break;
        }
      }
    }
    pcVar3 = "object";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar3,"ly_set_rm");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_set_rm(struct ly_set *set, void *object, void (*destructor)(void *obj))
{
    uint32_t i;

    LY_CHECK_ARG_RET(NULL, set, object, LY_EINVAL);

    /* get index */
    for (i = 0; i < set->count; i++) {
        if (set->objs[i] == object) {
            break;
        }
    }
    LY_CHECK_ERR_RET((i == set->count), LOGARG(NULL, object), LY_EINVAL); /* object is not in set */

    return ly_set_rm_index(set, i, destructor);
}